

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldpc.c
# Opt level: O0

void ldpc_generate_mat(m256v *L,parameters *P)

{
  int iVar1;
  int iVar2;
  int c;
  long in_RSI;
  int b_1;
  int a_1;
  int i_2;
  int i_1;
  int b;
  int a;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t val;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 local_14;
  
  m256v_clear((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  for (local_14 = 0; local_14 < *(int *)(in_RSI + 0x18); local_14 = local_14 + 1) {
    iVar1 = local_14 / *(int *)(in_RSI + 0x10) + 1;
    iVar2 = local_14 % *(int *)(in_RSI + 0x10);
    m256v_set_el((m256v *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8,(uint8_t)((uint)in_stack_ffffffffffffffd4 >> 0x18));
    iVar2 = (iVar2 + iVar1) % *(int *)(in_RSI + 0x10);
    m256v_set_el((m256v *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8,(uint8_t)((uint)in_stack_ffffffffffffffd4 >> 0x18));
    in_stack_ffffffffffffffe4 = (iVar2 + iVar1) % *(int *)(in_RSI + 0x10);
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                 (uint8_t)((uint)in_stack_ffffffffffffffd4 >> 0x18));
  }
  for (iVar1 = 0; iVar1 < *(int *)(in_RSI + 0x10); iVar1 = iVar1 + 1) {
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8,(uint8_t)((uint)in_stack_ffffffffffffffd4 >> 0x18));
  }
  for (iVar2 = 0; iVar2 < *(int *)(in_RSI + 0x10); iVar2 = iVar2 + 1) {
    c = iVar2 % *(int *)(in_RSI + 0x20);
    val = (uint8_t)((uint)((iVar2 + 1) % *(int *)(in_RSI + 0x20)) >> 0x18);
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),iVar2,c,val);
    m256v_set_el((m256v *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),iVar2,c,val);
  }
  return;
}

Assistant:

void ldpc_generate_mat(m256v* L, const parameters* P)
{
	assert(L->n_row == P->S);
	assert(L->n_col == P->L);

	m256v_clear(L);

	/* Fill in the left part (G_LDPC,1) */
	for (int i = 0; i < P->B; ++i) {
		const int a = 1 + i / P->S;
		int b = i % P->S;
		m256v_set_el(L, b, i, 1);
		b = (b + a) % P->S;
		m256v_set_el(L, b, i, 1);
		b = (b + a) % P->S;
		m256v_set_el(L, b, i, 1);
	}

	/* Add diagonal at offset B */
	for (int i = 0; i < P->S; ++i) {
		m256v_set_el(L, i, i + P->B, 1);
	}

	/* Double diagonal on the right (G_LDPC,2) */
	for (int i = 0; i < P->S; ++i) {
		const int a = i % P->P;
		const int b = (i + 1) % P->P;
		m256v_set_el(L, i, P->W + a, 1);
		m256v_set_el(L, i, P->W + b, 1);
	}
}